

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

void re2c::output_yyaccept_init(ostream *o,uint32_t ind,bool used_yyaccept)

{
  opt_t *poVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  int iVar3;
  string str;
  char *local_48;
  long local_40;
  char local_38;
  undefined7 uStack_37;
  
  if ((int)CONCAT71(in_register_00000011,used_yyaccept) != 0) {
    local_40 = 0;
    local_38 = '\0';
    iVar3 = ind + 1;
    local_48 = &local_38;
    while( true ) {
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      if ((poVar1->target == DOT) || (iVar3 = iVar3 + -1, iVar3 == 0)) break;
      poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      std::__cxx11::string::_M_append((char *)&local_48,(ulong)(poVar1->indString)._M_dataplus._M_p)
      ;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(o,local_48,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"unsigned int ",0xd);
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(poVar1->yyaccept)._M_dataplus._M_p,
                        (poVar1->yyaccept)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = 0;\n",6);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  return;
}

Assistant:

void output_yyaccept_init (std::ostream & o, uint32_t ind, bool used_yyaccept)
{
	if (used_yyaccept)
	{
		o << indent (ind) << "unsigned int " << opts->yyaccept << " = 0;\n";
	}
}